

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O3

WebPMuxError WebPMuxAssemble(WebPMux *mux,WebPData *assembled_data)

{
  ushort *puVar1;
  bool bVar2;
  WebPMuxError WVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint8_t *data;
  uint8_t *puVar10;
  WebPMuxImage *pWVar11;
  uint uVar12;
  byte bVar13;
  WebPMuxImage *pWVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  long lVar18;
  int num_frames;
  int num_anim_chunks;
  uint local_64;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  size_t local_58;
  size_t local_50;
  int local_44;
  WebPData local_40;
  
  if (assembled_data == (WebPData *)0x0) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  assembled_data->bytes = (uint8_t *)0x0;
  assembled_data->size = 0;
  if (mux == (WebPMux *)0x0) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  WVar3 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANMF,(int *)&local_64);
  if (WVar3 != WEBP_MUX_OK) {
    return WVar3;
  }
  if (local_64 == 1) {
    local_40.bytes = (uint8_t *)0x0;
    MuxImageGetNth(&mux->images_,1,(WebPMuxImage **)&local_40);
    if ((*(WebPChunk **)local_40.bytes != (WebPChunk *)0x0) &&
       (((mux->canvas_width_ == 0 && (mux->canvas_height_ == 0)) ||
        ((*(int *)(local_40.bytes + 0x20) == mux->canvas_width_ &&
         (*(int *)(local_40.bytes + 0x24) == mux->canvas_height_)))))) {
      ChunkDelete(*(WebPChunk **)local_40.bytes);
      local_40.bytes[0] = '\0';
      local_40.bytes[1] = '\0';
      local_40.bytes[2] = '\0';
      local_40.bytes[3] = '\0';
      local_40.bytes[4] = '\0';
      local_40.bytes[5] = '\0';
      local_40.bytes[6] = '\0';
      local_40.bytes[7] = '\0';
      local_64 = 0;
    }
  }
  WVar3 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANIM,&local_44);
  if (WVar3 == WEBP_MUX_OK) {
    if (((0 < local_44) && (local_64 == 0)) &&
       (WVar3 = MuxDeleteAllNamedData(mux,0x4d494e41), WVar3 != WEBP_MUX_OK)) {
      return WVar3;
    }
    local_40.size = 10;
    pWVar14 = mux->images_;
    if (((pWVar14 != (WebPMuxImage *)0x0) && (pWVar14->img_ != (WebPChunk *)0x0)) &&
       ((pWVar14->img_->data_).bytes != (uint8_t *)0x0)) {
      local_50 = CONCAT44(local_50._4_4_,0x58385056);
      local_40.bytes = (uint8_t *)&local_64;
      WVar3 = MuxDeleteAllNamedData(mux,0x58385056);
      if (1 < (uint)WVar3) {
        return WVar3;
      }
      bVar13 = 0;
      if (mux->iccp_ != (WebPChunk *)0x0) {
        bVar13 = ((mux->iccp_->data_).bytes != (uint8_t *)0x0) << 5;
      }
      if ((mux->exif_ != (WebPChunk *)0x0) && ((mux->exif_->data_).bytes != (uint8_t *)0x0)) {
        bVar13 = bVar13 | 8;
      }
      if ((mux->xmp_ != (WebPChunk *)0x0) && ((mux->xmp_->data_).bytes != (uint8_t *)0x0)) {
        bVar13 = bVar13 | 4;
      }
      if ((pWVar14->header_ != (WebPChunk *)0x0) && (pWVar14->header_->tag_ == 0x464d4e41)) {
        bVar13 = bVar13 | 2;
      }
      iVar4 = MuxImageCount(pWVar14,WEBP_CHUNK_ALPHA);
      bVar17 = bVar13;
      if (0 < iVar4) {
        bVar17 = bVar13 | 0x10;
      }
      pWVar11 = mux->images_;
      if (pWVar11->next_ == (WebPMuxImage *)0x0) {
        uVar5 = pWVar11->width_;
        uVar16 = pWVar11->height_;
      }
      else {
        uVar5 = 0;
        uVar16 = 0;
        do {
          if ((pWVar11->header_->data_).size != 0x10) {
            return WEBP_MUX_INVALID_ARGUMENT;
          }
          puVar1 = (ushort *)(pWVar11->header_->data_).bytes;
          uVar15 = (uint)(byte)puVar1[1] * 0x20000 + (uint)*puVar1 * 2 + pWVar11->width_;
          uVar12 = (uint)*(byte *)((long)puVar1 + 5) * 0x20000 +
                   (uint)*(ushort *)((long)puVar1 + 3) * 2 + pWVar11->height_;
          if ((int)uVar16 < (int)uVar12) {
            uVar16 = uVar12;
          }
          if ((int)uVar5 < (int)uVar15) {
            uVar5 = uVar15;
          }
          pWVar11 = pWVar11->next_;
        } while (pWVar11 != (WebPMuxImage *)0x0);
      }
      if ((((0 < (int)uVar5) && (0 < (int)uVar16)) && (uVar5 < 0x1000001)) && (uVar16 < 0x1000001))
      {
        uVar12 = mux->canvas_width_;
        if ((uVar12 != 0) || (mux->canvas_height_ != 0)) {
          if ((int)uVar12 < (int)uVar5) {
            return WEBP_MUX_INVALID_ARGUMENT;
          }
          bVar2 = mux->canvas_height_ < (int)uVar16;
          uVar16 = mux->canvas_height_;
          uVar5 = uVar12;
          if (bVar2) {
            return WEBP_MUX_INVALID_ARGUMENT;
          }
        }
        local_58 = CONCAT44(local_58._4_4_,uVar16);
        if ((bVar17 != 0) || (mux->unknown_ != (WebPChunk *)0x0)) {
          iVar4 = MuxHasAlpha(pWVar14);
          bVar13 = bVar13 | 0x10;
          if (iVar4 == 0) {
            bVar13 = bVar17;
          }
          local_64 = (uint)bVar13;
          iVar4 = uVar5 - 1;
          local_60 = (undefined1)iVar4;
          local_5f = (undefined1)((uint)iVar4 >> 8);
          local_5e = (undefined1)((uint)iVar4 >> 0x10);
          iVar4 = (int)local_58 + -1;
          local_5d = (undefined1)iVar4;
          local_5c = (undefined1)((uint)iVar4 >> 8);
          local_5b = (undefined1)((uint)iVar4 >> 0x10);
          WVar3 = MuxSet(mux,(uint32_t)local_50,&local_40,1);
          if (WVar3 != WEBP_MUX_OK) {
            return WVar3;
          }
        }
        sVar6 = ChunkListDiskSize(mux->vp8x_);
        sVar7 = ChunkListDiskSize(mux->iccp_);
        local_58 = ChunkListDiskSize(mux->anim_);
        pWVar14 = mux->images_;
        local_50 = sVar7;
        if (pWVar14 == (WebPMuxImage *)0x0) {
          lVar18 = 0;
        }
        else {
          lVar18 = 0;
          do {
            sVar7 = MuxImageDiskSize(pWVar14);
            lVar18 = lVar18 + sVar7;
            pWVar14 = pWVar14->next_;
          } while (pWVar14 != (WebPMuxImage *)0x0);
        }
        sVar7 = ChunkListDiskSize(mux->exif_);
        sVar8 = ChunkListDiskSize(mux->xmp_);
        sVar9 = ChunkListDiskSize(mux->unknown_);
        sVar6 = sVar6 + local_50 + local_58 + lVar18 + sVar7 + sVar8 + sVar9 + 0xc;
        data = (uint8_t *)WebPSafeMalloc(1,sVar6);
        if (data == (uint8_t *)0x0) {
          return WEBP_MUX_MEMORY_ERROR;
        }
        puVar10 = MuxEmitRiffHeader(data,sVar6);
        puVar10 = ChunkListEmit(mux->vp8x_,puVar10);
        puVar10 = ChunkListEmit(mux->iccp_,puVar10);
        puVar10 = ChunkListEmit(mux->anim_,puVar10);
        for (pWVar14 = mux->images_; pWVar14 != (WebPMuxImage *)0x0; pWVar14 = pWVar14->next_) {
          puVar10 = MuxImageEmit(pWVar14,puVar10);
        }
        puVar10 = ChunkListEmit(mux->exif_,puVar10);
        puVar10 = ChunkListEmit(mux->xmp_,puVar10);
        ChunkListEmit(mux->unknown_,puVar10);
        WVar3 = MuxValidate(mux);
        if (WVar3 != WEBP_MUX_OK) {
          WebPSafeFree(data);
          sVar6 = 0;
          data = (uint8_t *)0x0;
        }
        assembled_data->bytes = data;
        assembled_data->size = sVar6;
        return WVar3;
      }
    }
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  return WVar3;
}

Assistant:

WebPMuxError WebPMuxAssemble(WebPMux* mux, WebPData* assembled_data) {
  size_t size = 0;
  uint8_t* data = NULL;
  uint8_t* dst = NULL;
  WebPMuxError err;

  if (assembled_data == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  // Clean up returned data, in case something goes wrong.
  memset(assembled_data, 0, sizeof(*assembled_data));

  if (mux == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  // Finalize mux.
  err = MuxCleanup(mux);
  if (err != WEBP_MUX_OK) return err;
  err = CreateVP8XChunk(mux);
  if (err != WEBP_MUX_OK) return err;

  // Allocate data.
  size = ChunkListDiskSize(mux->vp8x_) + ChunkListDiskSize(mux->iccp_)
       + ChunkListDiskSize(mux->anim_) + ImageListDiskSize(mux->images_)
       + ChunkListDiskSize(mux->exif_) + ChunkListDiskSize(mux->xmp_)
       + ChunkListDiskSize(mux->unknown_) + RIFF_HEADER_SIZE;

  data = (uint8_t*)WebPSafeMalloc(1ULL, size);
  if (data == NULL) return WEBP_MUX_MEMORY_ERROR;

  // Emit header & chunks.
  dst = MuxEmitRiffHeader(data, size);
  dst = ChunkListEmit(mux->vp8x_, dst);
  dst = ChunkListEmit(mux->iccp_, dst);
  dst = ChunkListEmit(mux->anim_, dst);
  dst = ImageListEmit(mux->images_, dst);
  dst = ChunkListEmit(mux->exif_, dst);
  dst = ChunkListEmit(mux->xmp_, dst);
  dst = ChunkListEmit(mux->unknown_, dst);
  assert(dst == data + size);

  // Validate mux.
  err = MuxValidate(mux);
  if (err != WEBP_MUX_OK) {
    WebPSafeFree(data);
    data = NULL;
    size = 0;
  }

  // Finalize data.
  assembled_data->bytes = data;
  assembled_data->size = size;

  return err;
}